

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int luaK_exp2K(FuncState *fs,expdesc *e)

{
  int iVar1;
  Value *v;
  int iVar2;
  TValue k;
  Value local_30;
  byte local_28;
  Value local_20;
  undefined1 local_18;
  
  iVar2 = 0;
  if (e->t != e->f) {
    return 0;
  }
  switch(e->k) {
  case VNIL:
    v = &local_20;
    local_18 = 0;
    local_30 = (Value)fs->ls->h;
    local_28 = 0x45;
    goto LAB_0011da53;
  case VTRUE:
    local_28 = 0x11;
    break;
  case VFALSE:
    local_28 = 1;
    break;
  case VK:
    iVar1 = (e->u).info;
    goto LAB_0011da58;
  case VKFLT:
    iVar1 = luaK_numberK(fs,(e->u).nval);
    goto LAB_0011da58;
  case VKINT:
    local_30 = *(Value *)&e->u;
    local_28 = 3;
    break;
  case VKSTR:
    local_30 = (Value)(e->u).strval;
    local_28 = (local_30.gc)->tt | 0x40;
    break;
  default:
    goto switchD_0011d9e0_default;
  }
  v = &local_30;
LAB_0011da53:
  iVar1 = addk(fs,(TValue *)&local_30,(TValue *)v);
LAB_0011da58:
  if (iVar1 < 0x100) {
    e->k = VK;
    (e->u).info = iVar1;
    iVar2 = 1;
  }
switchD_0011d9e0_default:
  return iVar2;
}

Assistant:

static int luaK_exp2K (FuncState *fs, expdesc *e) {
  if (!hasjumps(e)) {
    int info;
    switch (e->k) {  /* move constants to 'k' */
      case VTRUE: info = boolT(fs); break;
      case VFALSE: info = boolF(fs); break;
      case VNIL: info = nilK(fs); break;
      case VKINT: info = luaK_intK(fs, e->u.ival); break;
      case VKFLT: info = luaK_numberK(fs, e->u.nval); break;
      case VKSTR: info = stringK(fs, e->u.strval); break;
      case VK: info = e->u.info; break;
      default: return 0;  /* not a constant */
    }
    if (info <= MAXINDEXRK) {  /* does constant fit in 'argC'? */
      e->k = VK;  /* make expression a 'K' expression */
      e->u.info = info;
      return 1;
    }
  }
  /* else, expression doesn't fit; leave it unchanged */
  return 0;
}